

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

bool __thiscall Value::asBoolean(Value *this)

{
  ThrowPacket *this_00;
  allocator<char> local_41;
  string local_40;
  ptr<Value> local_20;
  Value *local_10;
  Value *this_local;
  
  local_10 = this;
  this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Could not cast value to Boolean",&local_41);
  ExceptionObjects::bad_cast((ExceptionObjects *)&local_20,&local_40);
  ThrowPacket::ThrowPacket(this_00,&local_20);
  __cxa_throw(this_00,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
}

Assistant:

bool Value::asBoolean() {
    throw ThrowPacket(ExceptionObjects::bad_cast("Could not cast value to Boolean"));
}